

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autolink.cc
# Opt level: O0

base_learner * autolink_setup(options_i *options,vw *all)

{
  byte bVar1;
  uint32_t uVar2;
  pointer paVar3;
  single_learner *base;
  long *in_RDI;
  learner<autolink,_example> *ret;
  option_group_definition new_options;
  free_ptr<autolink> data;
  parameters *in_stack_fffffffffffffde8;
  vw *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffdf8;
  base_learner *in_stack_fffffffffffffe00;
  typed_option<unsigned_int> *op;
  option_group_definition *this;
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  undefined1 local_159 [33];
  typed_option<unsigned_int> local_138;
  allocator<char> local_81;
  string local_80 [32];
  undefined1 local_60 [16];
  learner<char,_char> *in_stack_ffffffffffffffb0;
  base_learner *local_8;
  
  scoped_calloc_or_throw<autolink>();
  this = (option_group_definition *)&local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Autolink",(allocator *)this);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffdf0,
             (string *)in_stack_fffffffffffffde8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  op = (typed_option<unsigned_int> *)local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_159 + 1),"autolink",(allocator *)op);
  std::unique_ptr<autolink,_void_(*)(void_*)>::operator->
            ((unique_ptr<autolink,_void_(*)(void_*)> *)0x3cb84c);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffffdf8,(uint *)in_stack_fffffffffffffdf0)
  ;
  VW::config::typed_option<unsigned_int>::keep(&local_138,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"create link function with polynomial d",&local_181);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffdf0,
             (string *)in_stack_fffffffffffffde8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>(this,op);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string((string *)(local_159 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_159);
  (**(code **)*in_RDI)(in_RDI,local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"autolink",&local_1a9);
  bVar1 = (**(code **)(*in_RDI + 8))(in_RDI,local_1a8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    uVar2 = parameters::stride_shift(in_stack_fffffffffffffde8);
    paVar3 = std::unique_ptr<autolink,_void_(*)(void_*)>::operator->
                       ((unique_ptr<autolink,_void_(*)(void_*)> *)0x3cbb46);
    paVar3->stride_shift = uVar2;
    in_stack_fffffffffffffe00 =
         setup_base((options_i *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    base = LEARNER::as_singleline<char,char>(in_stack_ffffffffffffffb0);
    in_stack_fffffffffffffdf0 =
         (vw *)LEARNER::init_learner<autolink,example,LEARNER::learner<char,example>>
                         ((free_ptr<autolink> *)in_stack_fffffffffffffe00,base,
                          (_func_void_autolink_ptr_learner<char,_example>_ptr_example_ptr *)
                          in_stack_fffffffffffffdf0,
                          (_func_void_autolink_ptr_learner<char,_example>_ptr_example_ptr *)
                          in_stack_fffffffffffffde8);
    local_8 = LEARNER::make_base<autolink,example>
                        ((learner<autolink,_example> *)in_stack_fffffffffffffdf0);
  }
  else {
    local_8 = (base_learner *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffdf0);
  std::unique_ptr<autolink,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<autolink,_void_(*)(void_*)> *)in_stack_fffffffffffffe00);
  return local_8;
}

Assistant:

LEARNER::base_learner* autolink_setup(options_i& options, vw& all)
{
  free_ptr<autolink> data = scoped_calloc_or_throw<autolink>();
  option_group_definition new_options("Autolink");
  new_options.add(make_option("autolink", data->d).keep().help("create link function with polynomial d"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("autolink"))
    return nullptr;

  data->stride_shift = all.weights.stride_shift();

  LEARNER::learner<autolink, example>& ret =
      init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);

  return make_base(ret);
}